

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O0

int unicode_prop(CharRange *cr,char *prop_name)

{
  int iVar1;
  CharRange *in_RDI;
  int ret;
  int prop_idx;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int local_20;
  int local_4;
  
  iVar1 = unicode_find_name((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (iVar1 < 0) {
    local_4 = -2;
  }
  else {
    local_20 = 0;
    switch(iVar1) {
    case 0x22:
      iVar1 = cr_add_interval((CharRange *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0,
                              0x1d04b9);
      if (iVar1 != 0) {
        return -1;
      }
      break;
    case 0x23:
      local_20 = unicode_prop_ops(in_RDI,0,0x43e,1,4,3,1,3,3,1,2,3,7);
      break;
    case 0x24:
      iVar1 = cr_add_interval((CharRange *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0,
                              0x1d04e7);
      if (iVar1 != 0) {
        return -1;
      }
      break;
    case 0x25:
      local_20 = unicode_prop_ops(in_RDI,0,1,6,7);
      break;
    case 0x26:
      local_20 = unicode_prop_ops(in_RDI,0,0xe,1,4,3,1,3,3,7);
      break;
    case 0x27:
      local_20 = unicode_prop_ops(in_RDI,2,4,1,0xe,5,7);
      break;
    case 0x28:
      local_20 = unicode_case1((CharRange *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                               in_stack_ffffffffffffff94);
      break;
    case 0x29:
      local_20 = unicode_case1((CharRange *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                               in_stack_ffffffffffffff94);
      break;
    case 0x2a:
      local_20 = unicode_prop_ops(in_RDI,2,4,1,0xf,5,7);
      break;
    case 0x2b:
      local_20 = unicode_prop_ops(in_RDI,2,1,1,0xd,5,7);
      break;
    case 0x2c:
      local_20 = unicode_case1((CharRange *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                               in_stack_ffffffffffffff94);
      break;
    case 0x2d:
      local_20 = unicode_prop_ops(in_RDI,0,0x3f000141,1,5,3,6,7);
      break;
    case 0x2e:
      local_20 = unicode_prop_ops(in_RDI,0,0x140,1,5,3,7);
      break;
    case 0x2f:
      local_20 = unicode_prop_ops(in_RDI,1,0x30,1,10,5,7);
      break;
    case 0x30:
      local_20 = unicode_prop_ops(in_RDI,0,4,1,3,3,7);
      break;
    case 0x31:
      local_20 = unicode_prop_ops(in_RDI,0,0x1000,1,1,3,7);
      break;
    case 0x32:
      local_20 = unicode_prop_ops(in_RDI,0,2,1,4,3,7);
      break;
    case 0x33:
      local_20 = unicode_prop_ops(in_RDI,0,0x106fe,1,7,3,1,8,3,1,0x1d,1,0x1e,3,1,0xc,3,6,4,7);
      break;
    case 0x34:
      local_20 = unicode_prop_ops(in_RDI,0,0x43e,1,7,3,1,0x1d,1,0x1e,3,1,0xb,3,6,4,7);
      break;
    default:
      if (0x31 < iVar1 + 0x10U) {
        return -2;
      }
      local_20 = unicode_prop1((CharRange *)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                               in_stack_ffffffffffffff84);
    }
    local_4 = local_20;
  }
  return local_4;
}

Assistant:

int unicode_prop(CharRange *cr, const char *prop_name)
{
    int prop_idx, ret;
    
    prop_idx = unicode_find_name(unicode_prop_name_table, prop_name);
    if (prop_idx < 0)
        return -2;
    prop_idx += UNICODE_PROP_ASCII_Hex_Digit;

    ret = 0;
    switch(prop_idx) {
    case UNICODE_PROP_ASCII:
        if (cr_add_interval(cr, 0x00, 0x7f + 1))
            return -1;
        break;
    case UNICODE_PROP_Any:
        if (cr_add_interval(cr, 0x00000, 0x10ffff + 1))
            return -1;
        break;
    case UNICODE_PROP_Assigned:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Cn),
                               POP_INVERT,
                               POP_END);
        break;
    case UNICODE_PROP_Math:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Sm),
                               POP_PROP, UNICODE_PROP_Other_Math,
                               POP_UNION,
                               POP_END);
        break;
    case UNICODE_PROP_Lowercase:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Ll),
                               POP_PROP, UNICODE_PROP_Other_Lowercase,
                               POP_UNION,
                               POP_END);
        break;
    case UNICODE_PROP_Uppercase:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Lu),
                               POP_PROP, UNICODE_PROP_Other_Uppercase,
                               POP_UNION,
                               POP_END);
        break;
    case UNICODE_PROP_Cased:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Lu) | M(Ll) | M(Lt),
                               POP_PROP, UNICODE_PROP_Other_Uppercase,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Other_Lowercase,
                               POP_UNION,
                               POP_END);
        break;
    case UNICODE_PROP_Alphabetic:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Lu) | M(Ll) | M(Lt) | M(Lm) | M(Lo) | M(Nl),
                               POP_PROP, UNICODE_PROP_Other_Uppercase,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Other_Lowercase,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Other_Alphabetic,
                               POP_UNION,
                               POP_END);
        break;
    case UNICODE_PROP_Grapheme_Base:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Cc) | M(Cf) | M(Cs) | M(Co) | M(Cn) | M(Zl) | M(Zp) | M(Me) | M(Mn),
                               POP_PROP, UNICODE_PROP_Other_Grapheme_Extend,
                               POP_UNION,
                               POP_INVERT,
                               POP_END);
        break;
    case UNICODE_PROP_Grapheme_Extend:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Me) | M(Mn),
                               POP_PROP, UNICODE_PROP_Other_Grapheme_Extend,
                               POP_UNION,
                               POP_END);
        break;
    case UNICODE_PROP_XID_Start:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Lu) | M(Ll) | M(Lt) | M(Lm) | M(Lo) | M(Nl),
                               POP_PROP, UNICODE_PROP_Other_ID_Start,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Pattern_Syntax,
                               POP_PROP, UNICODE_PROP_Pattern_White_Space,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_XID_Start1,
                               POP_UNION,
                               POP_INVERT,
                               POP_INTER,
                               POP_END);
        break;
    case UNICODE_PROP_XID_Continue:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Lu) | M(Ll) | M(Lt) | M(Lm) | M(Lo) | M(Nl) |
                               M(Mn) | M(Mc) | M(Nd) | M(Pc),
                               POP_PROP, UNICODE_PROP_Other_ID_Start,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Other_ID_Continue,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Pattern_Syntax,
                               POP_PROP, UNICODE_PROP_Pattern_White_Space,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_XID_Continue1,
                               POP_UNION,
                               POP_INVERT,
                               POP_INTER,
                               POP_END);
        break;
    case UNICODE_PROP_Changes_When_Uppercased:
        ret = unicode_case1(cr, CASE_U);
        break;
    case UNICODE_PROP_Changes_When_Lowercased:
        ret = unicode_case1(cr, CASE_L);
        break;
    case UNICODE_PROP_Changes_When_Casemapped:
        ret = unicode_case1(cr, CASE_U | CASE_L | CASE_F);
        break;
    case UNICODE_PROP_Changes_When_Titlecased:
        ret = unicode_prop_ops(cr,
                               POP_CASE, CASE_U,
                               POP_PROP, UNICODE_PROP_Changes_When_Titlecased1,
                               POP_XOR,
                               POP_END);
        break;
    case UNICODE_PROP_Changes_When_Casefolded:
        ret = unicode_prop_ops(cr,
                               POP_CASE, CASE_F,
                               POP_PROP, UNICODE_PROP_Changes_When_Casefolded1,
                               POP_XOR,
                               POP_END);
        break;
    case UNICODE_PROP_Changes_When_NFKC_Casefolded:
        ret = unicode_prop_ops(cr,
                               POP_CASE, CASE_F,
                               POP_PROP, UNICODE_PROP_Changes_When_NFKC_Casefolded1,
                               POP_XOR,
                               POP_END);
        break;
#if 0
    case UNICODE_PROP_ID_Start:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Lu) | M(Ll) | M(Lt) | M(Lm) | M(Lo) | M(Nl),
                               POP_PROP, UNICODE_PROP_Other_ID_Start,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Pattern_Syntax,
                               POP_PROP, UNICODE_PROP_Pattern_White_Space,
                               POP_UNION,
                               POP_INVERT,
                               POP_INTER,
                               POP_END);
        break;
    case UNICODE_PROP_ID_Continue:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Lu) | M(Ll) | M(Lt) | M(Lm) | M(Lo) | M(Nl) |
                               M(Mn) | M(Mc) | M(Nd) | M(Pc),
                               POP_PROP, UNICODE_PROP_Other_ID_Start,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Other_ID_Continue,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Pattern_Syntax,
                               POP_PROP, UNICODE_PROP_Pattern_White_Space,
                               POP_UNION,
                               POP_INVERT,
                               POP_INTER,
                               POP_END);
        break;
    case UNICODE_PROP_Case_Ignorable:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Mn) | M(Cf) | M(Lm) | M(Sk),
                               POP_PROP, UNICODE_PROP_Case_Ignorable1,
                               POP_XOR,
                               POP_END);
        break;
#else
        /* we use the existing tables */
    case UNICODE_PROP_ID_Continue:
        ret = unicode_prop_ops(cr,
                               POP_PROP, UNICODE_PROP_ID_Start,
                               POP_PROP, UNICODE_PROP_ID_Continue1,
                               POP_XOR,
                               POP_END);
        break;
#endif
    default:
        if (prop_idx >= countof(unicode_prop_table))
            return -2;
        ret = unicode_prop1(cr, prop_idx);
        break;
    }
    return ret;
}